

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuIncrSchemaCookie(sqlite3rbu *p)

{
  int iVar1;
  sqlite3 *local_30;
  sqlite3_stmt *local_28;
  sqlite3_stmt *pStmt;
  sqlite3 *psStack_18;
  int iCookie;
  sqlite3 *dbread;
  sqlite3rbu *p_local;
  
  if (p->rc == 0) {
    if (p->zTarget == (char *)0x0) {
      local_30 = p->dbRbu;
    }
    else {
      local_30 = p->dbMain;
    }
    psStack_18 = local_30;
    pStmt._4_4_ = 1000000;
    dbread = (sqlite3 *)p;
    iVar1 = prepareAndCollectError(local_30,&local_28,&p->zErrmsg,"PRAGMA schema_version");
    *(int *)&dbread->lastRowid = iVar1;
    if ((int)dbread->lastRowid == 0) {
      iVar1 = sqlite3_step(local_28);
      if (iVar1 == 100) {
        pStmt._4_4_ = sqlite3_column_int(local_28,0);
      }
      rbuFinalize((sqlite3rbu *)dbread,local_28);
    }
    if ((int)dbread->lastRowid == 0) {
      rbuMPrintfExec((sqlite3rbu *)dbread,(sqlite3 *)dbread->pVdbe,"PRAGMA schema_version = %d",
                     (ulong)(pStmt._4_4_ + 1));
    }
  }
  return;
}

Assistant:

static void rbuIncrSchemaCookie(sqlite3rbu *p){
  if( p->rc==SQLITE_OK ){
    sqlite3 *dbread = (rbuIsVacuum(p) ? p->dbRbu : p->dbMain);
    int iCookie = 1000000;
    sqlite3_stmt *pStmt;

    p->rc = prepareAndCollectError(dbread, &pStmt, &p->zErrmsg, 
        "PRAGMA schema_version"
    );
    if( p->rc==SQLITE_OK ){
      /* Coverage: it may be that this sqlite3_step() cannot fail. There
      ** is already a transaction open, so the prepared statement cannot
      ** throw an SQLITE_SCHEMA exception. The only database page the
      ** statement reads is page 1, which is guaranteed to be in the cache.
      ** And no memory allocations are required.  */
      if( SQLITE_ROW==sqlite3_step(pStmt) ){
        iCookie = sqlite3_column_int(pStmt, 0);
      }
      rbuFinalize(p, pStmt);
    }
    if( p->rc==SQLITE_OK ){
      rbuMPrintfExec(p, p->dbMain, "PRAGMA schema_version = %d", iCookie+1);
    }
  }
}